

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

void handleSelectionRequest(XEvent *event)

{
  Atom AVar1;
  Atom AVar2;
  Display *pDVar3;
  char *pcVar4;
  unsigned_long uVar5;
  size_t sVar6;
  Atom AVar7;
  long lVar8;
  ulong uVar9;
  Window WVar10;
  Atom *pAVar11;
  undefined8 uVar12;
  Atom formats [3];
  Atom targets [5];
  XEvent response;
  
  AVar7 = 0;
  memset(&response,0,0xc0);
  pcVar4 = _glfw.x11.clipboardString;
  pDVar3 = _glfw.x11.display;
  formats[0] = _glfw.x11.UTF8_STRING;
  formats[1] = _glfw.x11.COMPOUND_STRING;
  formats[2] = 0x1f;
  AVar1 = (event->xselectionrequest).property;
  if (AVar1 == 0) goto LAB_001dc453;
  AVar2 = (event->xkey).time;
  if (AVar2 == _glfw.x11.TARGETS) {
    pAVar11 = targets;
    targets[0] = _glfw.x11.TARGETS;
    targets[1] = _glfw.x11.MULTIPLE;
    targets[2] = _glfw.x11.UTF8_STRING;
    targets[3] = _glfw.x11.COMPOUND_STRING;
    targets[4] = 0x1f;
    WVar10 = (event->xkey).root;
    uVar12 = 5;
    AVar7 = 4;
LAB_001dc34a:
    XChangeProperty(_glfw.x11.display,WVar10,AVar1,AVar7,0x20,0,pAVar11,uVar12);
  }
  else {
    if (AVar2 != _glfw.x11.MULTIPLE) {
      if (AVar2 != _glfw.x11.SAVE_TARGETS) {
        AVar7 = 0;
        lVar8 = 0;
        do {
          if (AVar2 == formats[lVar8]) {
            WVar10 = (event->xkey).root;
            sVar6 = strlen(_glfw.x11.clipboardString);
            XChangeProperty(pDVar3,WVar10,AVar1,AVar2,8,0,pcVar4,sVar6);
            AVar7 = (event->xselectionrequest).property;
            break;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        goto LAB_001dc453;
      }
      WVar10 = (event->xkey).root;
      uVar12 = 0;
      pAVar11 = (Atom *)0x0;
      AVar7 = _glfw.x11.NULL_;
      goto LAB_001dc34a;
    }
    uVar5 = _glfwGetWindowProperty((event->xkey).root,AVar1,_glfw.x11.ATOM_PAIR,(uchar **)targets);
    if (uVar5 != 0) {
      uVar9 = 0;
      do {
        pcVar4 = _glfw.x11.clipboardString;
        pDVar3 = _glfw.x11.display;
        AVar1 = *(Atom *)(targets[0] + uVar9 * 8);
        lVar8 = 0;
        do {
          if (AVar1 == formats[lVar8]) {
            WVar10 = (event->xkey).root;
            uVar12 = *(undefined8 *)(targets[0] + 8 + uVar9 * 8);
            sVar6 = strlen(_glfw.x11.clipboardString);
            XChangeProperty(pDVar3,WVar10,uVar12,AVar1,8,0,pcVar4,sVar6);
            goto LAB_001dc402;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        *(undefined8 *)(targets[0] + 8 + uVar9 * 8) = 0;
LAB_001dc402:
        uVar9 = uVar9 + 2;
      } while (uVar9 < uVar5);
    }
    XChangeProperty(_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
                    _glfw.x11.ATOM_PAIR,0x20,0,targets[0],uVar5);
    XFree(targets[0]);
  }
  AVar7 = (event->xselectionrequest).property;
LAB_001dc453:
  response.type = 0x1f;
  response.xany.display = (event->xany).display;
  response.xany.window = (event->xkey).root;
  response.xkey.root = (event->xkey).subwindow;
  response.xkey.subwindow = (event->xkey).time;
  response.xselectionrequest.property = (event->xconfigure).above;
  response.xkey.time = AVar7;
  XSendEvent(_glfw.x11.display,response.xany.window,0,0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent response;
    memset(&response, 0, sizeof(response));

    response.xselection.property = writeTargetToProperty(request);
    response.xselection.type = SelectionNotify;
    response.xselection.display = request->display;
    response.xselection.requestor = request->requestor;
    response.xselection.selection = request->selection;
    response.xselection.target = request->target;
    response.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &response);
}